

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O3

void Assert::throwif(bool b,string *message)

{
  undefined8 uVar1;
  undefined7 in_register_00000039;
  ostringstream buf;
  ostringstream aoStack_188 [376];
  
  if ((int)CONCAT71(in_register_00000039,b) == 0) {
    unit_test_runner.passed = unit_test_runner.passed + 1;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(aoStack_188,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"Assert error: ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,(message->_M_dataplus)._M_p,message->_M_string_length);
  uVar1 = __cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  __cxa_throw(uVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Assert::throwif(bool b, const string &message)
{
    if (b) {
        std::ostringstream buf(std::ostringstream::out);
        buf << "Assert error: " << message;
        throw buf.str();
    }
    ++unit_test_runner.passed;
}